

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::BufferObjectQueryTests::init
          (BufferObjectQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  BufferParamVerifier *verifier_00;
  undefined4 extraout_var;
  BufferCase *pBVar3;
  BufferParamVerifier *verifier;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  verifier_00 = (BufferParamVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BufferParamVerifiers::GetBufferParameterIVerifier::GetBufferParameterIVerifier
            ((GetBufferParameterIVerifier *)verifier_00,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInt = (GetBufferParameterIVerifier *)verifier_00;
  pBVar3 = (BufferCase *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"buffer_size",&local_69);
  std::operator+(&local_48,&local_68,verifier_00->m_testNamePostfix);
  anon_unknown_2::BufferCase::BufferCase
            (pBVar3,pCVar1,verifier_00,local_48._M_dataplus._M_p,"BUFFER_SIZE");
  (pBVar3->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e183e8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  pBVar3 = (BufferCase *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"buffer_usage",&local_69);
  std::operator+(&local_48,&local_68,verifier_00->m_testNamePostfix);
  anon_unknown_2::BufferCase::BufferCase
            (pBVar3,pCVar1,verifier_00,local_48._M_dataplus._M_p,"BUFFER_USAGE");
  (pBVar3->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e184a8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  std::__cxx11::string::~string((string *)&local_48);
  iVar2 = std::__cxx11::string::~string((string *)&local_68);
  return iVar2;
}

Assistant:

void BufferObjectQueryTests::init (void)
{
	using namespace BufferParamVerifiers;

	DE_ASSERT(m_verifierInt == DE_NULL);

	m_verifierInt		= new GetBufferParameterIVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	BufferParamVerifier* verifiers[] = {m_verifierInt};

	FOR_EACH_VERIFIER(verifiers, addChild(new BufferSizeCase		(m_context, verifier,	(std::string("buffer_size")				+ verifier->getTestNamePostfix()).c_str(), "BUFFER_SIZE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new BufferUsageCase		(m_context, verifier,	(std::string("buffer_usage")			+ verifier->getTestNamePostfix()).c_str(), "BUFFER_USAGE")));
}